

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::segment::Atlas::Atlas(Atlas *this)

{
  (this->m_edgeLengths).m_base.buffer = (uint8_t *)0x0;
  (this->m_edgeLengths).m_base.elementSize = 4;
  (this->m_edgeLengths).m_base.size = 0;
  (this->m_edgeLengths).m_base.capacity = 0;
  (this->m_faceAreas).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceAreas).m_base.elementSize = 4;
  (this->m_faceAreas).m_base.size = 0;
  (this->m_faceAreas).m_base.capacity = 0;
  (this->m_faceNormals).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceNormals).m_base.elementSize = 0xc;
  (this->m_faceNormals).m_base.size = 0;
  (this->m_faceNormals).m_base.capacity = 0;
  (this->m_texcoords).m_base.buffer = (uint8_t *)0x0;
  (this->m_texcoords).m_base.elementSize = 8;
  (this->m_texcoords).m_base.size = 0;
  (this->m_texcoords).m_base.capacity = 0;
  (this->m_faceCharts).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceCharts).m_base.elementSize = 4;
  (this->m_faceCharts).m_base.size = 0;
  (this->m_faceCharts).m_base.capacity = 0;
  (this->m_charts).m_base.buffer = (uint8_t *)0x0;
  (this->m_charts).m_base.elementSize = 8;
  (this->m_charts).m_base.size = 0;
  (this->m_charts).m_base.capacity = 0;
  (this->m_bestTriangles).m_maxSize = 10;
  (this->m_bestTriangles).m_pairs.m_base.buffer = (uint8_t *)0x0;
  (this->m_bestTriangles).m_pairs.m_base.elementSize = 8;
  (this->m_bestTriangles).m_pairs.m_base.size = 0;
  (this->m_bestTriangles).m_pairs.m_base.capacity = 0;
  (this->m_rand).x = 0x75bcd15;
  (this->m_rand).y = 0x159a55a0;
  (this->m_rand).z = 0x1f123bb5;
  (this->m_rand).c = 0x74cbb1;
  (this->m_options).maxChartArea = 0.0;
  (this->m_options).maxBoundaryLength = 0.0;
  (this->m_options).proxyFitMetricWeight = 2.0;
  (this->m_options).roundnessMetricWeight = 0.01;
  (this->m_options).straightnessMetricWeight = 6.0;
  (this->m_options).normalSeamMetricWeight = 4.0;
  (this->m_options).textureSeamMetricWeight = 0.5;
  (this->m_options).maxThreshold = 2.0;
  (this->m_options).maxIterations = 1;
  (this->m_nextPlanarRegionFace).m_base.buffer = (uint8_t *)0x0;
  (this->m_nextPlanarRegionFace).m_base.elementSize = 4;
  (this->m_nextPlanarRegionFace).m_base.size = 0;
  (this->m_nextPlanarRegionFace).m_base.capacity = 0;
  (this->m_facePlanarRegionId).m_base.buffer = (uint8_t *)0x0;
  (this->m_facePlanarRegionId).m_base.elementSize = 4;
  (this->m_facePlanarRegionId).m_base.size = 0;
  (this->m_facePlanarRegionId).m_base.capacity = 0;
  (this->m_tempPoints).m_base.buffer = (uint8_t *)0x0;
  (this->m_tempPoints).m_base.elementSize = 0xc;
  (this->m_tempPoints).m_base.size = 0;
  (this->m_tempPoints).m_base.capacity = 0;
  (this->m_boundaryGrid).m_edges.m_base.buffer = (uint8_t *)0x0;
  (this->m_boundaryGrid).m_edges.m_base.elementSize = 4;
  (this->m_boundaryGrid).m_edges.m_base.size = 0;
  (this->m_boundaryGrid).m_edges.m_base.capacity = 0;
  (this->m_boundaryGrid).m_cellDataOffsets.m_base.buffer = (uint8_t *)0x0;
  (this->m_boundaryGrid).m_cellDataOffsets.m_base.elementSize = 4;
  (this->m_boundaryGrid).m_cellDataOffsets.m_base.size = 0;
  (this->m_boundaryGrid).m_cellDataOffsets.m_base.capacity = 0;
  (this->m_boundaryGrid).m_cellData.m_base.buffer = (uint8_t *)0x0;
  (this->m_boundaryGrid).m_cellData.m_base.elementSize = 4;
  (this->m_boundaryGrid).m_cellData.m_base.size = 0;
  (this->m_boundaryGrid).m_cellData.m_base.capacity = 0;
  (this->m_boundaryGrid).m_potentialEdges.m_base.buffer = (uint8_t *)0x0;
  (this->m_boundaryGrid).m_potentialEdges.m_base.elementSize = 4;
  (this->m_boundaryGrid).m_potentialEdges.m_base.size = 0;
  (this->m_boundaryGrid).m_potentialEdges.m_base.capacity = 0;
  (this->m_boundaryGrid).m_traversedCellOffsets.m_base.buffer = (uint8_t *)0x0;
  (this->m_boundaryGrid).m_traversedCellOffsets.m_base.elementSize = 4;
  (this->m_boundaryGrid).m_traversedCellOffsets.m_base.size = 0;
  (this->m_boundaryGrid).m_traversedCellOffsets.m_base.capacity = 0;
  (this->m_sharedBoundaryLengths).m_base.buffer = (uint8_t *)0x0;
  (this->m_sharedBoundaryLengths).m_base.elementSize = 4;
  (this->m_sharedBoundaryLengths).m_base.size = 0;
  (this->m_sharedBoundaryLengths).m_base.capacity = 0;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.buffer = (uint8_t *)0x0;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.elementSize = 4;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.size = 0;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.capacity = 0;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.buffer = (uint8_t *)0x0;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.elementSize = 4;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.size = 0;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.capacity = 0;
  return;
}

Assistant:

Atlas() : m_edgeLengths(MemTag::SegmentAtlasMeshData), m_faceAreas(MemTag::SegmentAtlasMeshData), m_faceNormals(MemTag::SegmentAtlasMeshData), m_texcoords(MemTag::SegmentAtlasMeshData), m_bestTriangles(10), m_nextPlanarRegionFace(MemTag::SegmentAtlasPlanarRegions), m_facePlanarRegionId(MemTag::SegmentAtlasPlanarRegions) {}